

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  char (*format_str) [2221];
  int local_14 [2];
  char local_c [4];
  
  local_c[0] = '\0';
  local_c[1] = '\0';
  local_c[2] = '\0';
  local_c[3] = '\0';
  local_14[1] = 5;
  local_14[0] = 0;
  format_str = (char (*) [2221])local_c;
  fmt::v7::print<char[19],int,int,int,char>
            ((char (*) [19])"Baryonyx v{}.{}.{}",(int *)format_str,local_14 + 1,local_14);
  fmt::v7::print<char[2221],,char>
            ((v7 *)
             "\nGeneral options:\n  --help|-h                     This help message\n  --param|-p [name][:|=][value] Add a new parameter (name is [a-z][A-Z]_) value can be a double, an integer otherwise a string.\n  --disable-preprocessing|-np   Disable preprocessing\n  --optimize|-O                 Optimize model (default feasibility search only)\n  --auto:[manual,nlopt]|-a      Automatic parameters optimization\n  --check filename.sol          Check if the solution is correct.  --random                      Use the random solver instead of bastert and wedelin\n\n  --quiet                       Remove any verbose message\n  --verbose|-v int              Set verbose level\n  --bench|-b file_name.csv      Select the bench mode and store in file_name.csv\n\n  --debug                       Enable a debug mode\nParameter list for in the middle heuristic\n * Global parameters  - limit: integer ]-oo, +oo[ in loop number\n  - time-limit: real [0, +oo[ in seconds\n  - floating-point-type: float double longdouble\n  - observer-type: none (default), pnm, file\n  - storage-type: one bound five\n  - print-level: [0, 2]\n * In The Middle parameters\n  - preprocessing: none memory less-greater-equal (or any combination), p1, p2, p3, p4\n  - constraint-order: none reversing random-sorting infeasibility-decr infeasibility-incr lagrangian-decr lagrangian-incr pi-sign-change\n  - theta: real [0, 1]\n  - delta: real [0, +oo[\n  - kappa-min: real [0, 1[\n  - kappa-step: real [0, 1[\n  - kappa-max: real [0, 1[\n  - alpha: integer [0, 2]\n  - w: integer [0, +oo[\n  - norm: l1 l2 loo none random\n * Pushes system parameters\n  - pushes-limit: integer [0, +oo[\n  - pushing-objective-amplifier: real [0, +oo[\n  - pushing-iteration-limit: integer [0, +oo[\n  - pushing-k-factor: real [0, +oo[\n * Initialization parameters\n  - init-policy: bastert pessimistic-solve optimistic-solve cycle\n  - init-population-size: integer [5, +oo[\n  - init-crossover-bastert-insertion:real [0, 1]\n  - init-crossover-solution-selection-mean:real [0, 1]\n  - init-crossover-solution-selection-stddev:real [0, 1]\n  ..." /* TRUNCATED STRING LITERAL */
             ,format_str);
  return;
}

Assistant:

static void
help() noexcept
{
    fmt::print(
      "Baryonyx v{}.{}.{}", VERSION_MAJOR, VERSION_MINOR, VERSION_PATCH);

    fmt::print(
      "\nGeneral options:\n"
      "  --help|-h                     This help message\n"
      "  --param|-p [name][:|=][value] Add a new parameter (name is"
      " [a-z][A-Z]_) value can be a double, an integer otherwise a"
      " string.\n"
      "  --disable-preprocessing|-np   Disable preprocessing\n"
      "  --optimize|-O                 Optimize model (default "
      "feasibility search only)\n"
      "  --auto:[manual,nlopt]|-a      Automatic parameters optimization\n"
      "  --check filename.sol          Check if the solution is correct."
      "  --random                      Use the random solver instead of "
      "bastert and wedelin\n"
      "\n"
      "  --quiet                       Remove any verbose message\n"
      "  --verbose|-v int              Set verbose level\n"
      "  --bench|-b file_name.csv      Select the bench mode and store in "
      "file_name.csv\n\n"
      "  --debug                       Enable a debug mode\n"
      "Parameter list for in the middle heuristic\n"
      " * Global parameters"
      "  - limit: integer ]-oo, +oo[ in loop number\n"
      "  - time-limit: real [0, +oo[ in seconds\n"
      "  - floating-point-type: float double longdouble\n"
      "  - observer-type: none (default), pnm, file\n"
      "  - storage-type: one bound five\n"
      "  - print-level: [0, 2]\n"
      " * In The Middle parameters\n"
      "  - preprocessing: none memory less-greater-equal (or any "
      "combination), p1, p2, p3, p4\n"
      "  - constraint-order: none reversing random-sorting "
      "infeasibility-decr infeasibility-incr lagrangian-decr "
      "lagrangian-incr "
      "pi-sign-change\n"
      "  - theta: real [0, 1]\n"
      "  - delta: real [0, +oo[\n"
      "  - kappa-min: real [0, 1[\n"
      "  - kappa-step: real [0, 1[\n"
      "  - kappa-max: real [0, 1[\n"
      "  - alpha: integer [0, 2]\n"
      "  - w: integer [0, +oo[\n"
      "  - norm: l1 l2 loo none random\n"
      " * Pushes system parameters\n"
      "  - pushes-limit: integer [0, +oo[\n"
      "  - pushing-objective-amplifier: real [0, +oo[\n"
      "  - pushing-iteration-limit: integer [0, +oo[\n"
      "  - pushing-k-factor: real [0, +oo[\n"
      " * Initialization parameters\n"
      "  - init-policy: bastert pessimistic-solve optimistic-solve cycle\n"
      "  - init-population-size: integer [5, +oo[\n"
      "  - init-crossover-bastert-insertion:real [0, 1]\n"
      "  - init-crossover-solution-selection-mean:real [0, 1]\n"
      "  - init-crossover-solution-selection-stddev:real [0, 1]\n"
      "  - init-mutation-variable-mean:real [0, 1]\n"
      "  - init-mutation-variable-stddev:real [0, 1]\n"
      "  - init-mutation-value-mean:real [0, 1]\n"
      "  - init-mutation-value-stddev:real [0, 1]\n");
}